

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * __thiscall
slang::ast::IntegralType::fromSyntax
          (IntegralType *this,Compilation *compilation,SyntaxKind integerKind,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          dimensions,bool isSigned,ASTContext *context)

{
  ulong uVar1;
  byte bVar2;
  undefined4 in_register_00000014;
  long lVar3;
  SyntaxKind kind;
  undefined7 in_register_00000089;
  char *pcVar4;
  Type *unaff_R15;
  VariableDimensionSyntax *dimSyntax;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
  dims;
  EvaluatedDimension dim;
  bool local_124;
  VariableDimensionSyntax *local_110;
  int *local_108;
  char *local_100;
  SourceLocation local_f8;
  int local_f0 [40];
  EvaluatedDimension local_50;
  
  kind = (SyntaxKind)compilation;
  local_108 = local_f0;
  local_100 = (char *)0x0;
  local_f8 = (SourceLocation)0x4;
  if (dimensions._M_ptr != (pointer)0x0) {
    lVar3 = 0;
    unaff_R15 = (Type *)&local_110;
    do {
      local_110 = *(VariableDimensionSyntax **)(CONCAT44(in_register_00000014,integerKind) + lVar3);
      ASTContext::evalPackedDimension
                (&local_50,(ASTContext *)CONCAT71(in_register_00000089,isSigned),local_110);
      SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>::
      emplace_back<slang::ast::EvaluatedDimension&,slang::syntax::VariableDimensionSyntax_const*&>
                ((SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>
                  *)&local_108,&local_50,(VariableDimensionSyntax **)unaff_R15);
      lVar3 = lVar3 + 8;
    } while ((long)dimensions._M_ptr << 3 != lVar3);
  }
  local_124 = dimensions._M_extent._M_extent_value._0_1_;
  if (local_100 == (char *)0x0) {
    unaff_R15 = Type::getPredefinedType((Compilation *)this,kind,local_124);
  }
  else {
    bVar2 = (kind == RegType) << 2 | 2;
    if (kind == BitType) {
      bVar2 = 0;
    }
    if ((local_100 == (char *)0x1) && (*local_108 - 1U < 2)) {
      uVar1 = *(ulong *)(local_108 + 1);
      if (uVar1 < 0x80000000) {
        unaff_R15 = Compilation::getType
                              ((Compilation *)this,(int)uVar1 + 1,
                               (bitmask<slang::ast::IntegralFlags>)(bVar2 + local_124));
      }
      if (uVar1 >> 0x1f == 0) goto LAB_004234ab;
    }
    unaff_R15 = Compilation::getScalarType
                          ((Compilation *)this,
                           (bitmask<slang::ast::IntegralFlags>)(bVar2 + local_124));
    if (local_100 != (char *)0x0) {
      pcVar4 = local_100;
      lVar3 = (long)local_100 * 0x28;
      do {
        unaff_R15 = PackedArrayType::fromSyntax
                              ((((ASTContext *)CONCAT71(in_register_00000089,isSigned))->scope).ptr,
                               unaff_R15,(EvaluatedDimension *)((long)local_108 + lVar3 + -0x28),
                               *(SyntaxNode **)((long)local_108 + lVar3 + -8));
        pcVar4 = pcVar4 + -1;
        lVar3 = lVar3 + -0x28;
      } while (pcVar4 != (char *)0x0);
    }
  }
LAB_004234ab:
  if (local_108 != local_f0) {
    operator_delete(local_108);
  }
  return unaff_R15;
}

Assistant:

const Type& IntegralType::fromSyntax(Compilation& compilation, SyntaxKind integerKind,
                                     std::span<const VariableDimensionSyntax* const> dimensions,
                                     bool isSigned, const ASTContext& context) {
    // This is a simple integral vector (possibly of just one element).
    SmallVector<std::pair<EvaluatedDimension, const SyntaxNode*>, 4> dims;
    for (auto dimSyntax : dimensions) {
        auto dim = context.evalPackedDimension(*dimSyntax);
        dims.emplace_back(dim, dimSyntax);
    }

    if (dims.empty())
        return getPredefinedType(compilation, integerKind, isSigned);

    bitmask<IntegralFlags> flags;
    if (integerKind == SyntaxKind::RegType)
        flags |= IntegralFlags::Reg;
    if (isSigned)
        flags |= IntegralFlags::Signed;
    if (integerKind != SyntaxKind::BitType)
        flags |= IntegralFlags::FourState;

    if (dims.size() == 1 && dims[0].first.isRange()) {
        auto range = dims[0].first.range;
        if (range.right == 0 && range.left >= 0) {
            // if we have the common case of only one dimension and lsb == 0
            // then we can use the shared representation
            return compilation.getType(range.width(), flags);
        }
    }

    const Type* result = &compilation.getScalarType(flags);
    size_t count = dims.size();
    for (size_t i = 0; i < count; i++) {
        auto& pair = dims[count - i - 1];
        result = &PackedArrayType::fromSyntax(*context.scope, *result, pair.first, *pair.second);
    }

    return *result;
}